

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::accessChainLoad
          (Builder *this,Decoration precision,Decoration l_nonUniform,Decoration r_nonUniform,
          Id resultType,MemoryAccessMask memoryAccess,Scope scope,uint alignment)

{
  uint *puVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  Instruction *pIVar5;
  bool bVar6;
  StorageClass SVar7;
  Id IVar8;
  Id IVar9;
  ulong uVar10;
  uint *puVar11;
  uint *puVar12;
  ulong uVar13;
  MemoryAccessMask memoryAccess_00;
  long lVar14;
  long lVar15;
  pointer ppIVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  uint local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  if ((this->accessChain).isRValue == true) {
    transferAccessChainSwizzle(this,false);
    if ((this->accessChain).indexChain.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->accessChain).indexChain.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      IVar8 = (this->accessChain).base;
    }
    else {
      IVar8 = (this->accessChain).preSwizzleBaseType;
      if (IVar8 == 0) {
        IVar8 = resultType;
      }
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      puVar11 = (this->accessChain).indexChain.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar10 = (long)(this->accessChain).indexChain.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar11;
      if ((int)(uVar10 >> 2) < 1) {
LAB_00469975:
        IVar8 = createCompositeExtract(this,(this->accessChain).base,IVar8,&local_48);
        if ((precision != DecorationMax) && (IVar8 != 0)) {
          addDecoration(this,IVar8,precision,-1);
        }
      }
      else {
        ppIVar16 = (this->module).idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if (ppIVar16[*puVar11]->opCode == OpConstant) {
          lVar14 = 1;
          lVar15 = 0;
          puVar12 = puVar11;
          do {
            local_4c = getConstantScalar(this,*puVar12);
            if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_48,
                         (iterator)
                         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_4c);
            }
            else {
              *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_4c;
              local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            puVar11 = (this->accessChain).indexChain.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar10 = (long)(this->accessChain).indexChain.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar11;
            if ((int)(uVar10 >> 2) <= lVar14) goto LAB_00469975;
            lVar15 = lVar15 + 1;
            puVar12 = puVar11 + lVar15;
            puVar1 = puVar11 + lVar14;
            ppIVar16 = (this->module).idToInstruction.
                       super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            lVar14 = lVar14 + 1;
          } while (ppIVar16[*puVar1]->opCode == OpConstant);
        }
        uVar2 = (this->accessChain).base;
        if (ppIVar16[uVar2] == (Instruction *)0x0) {
          uVar13 = 0;
        }
        else {
          uVar13 = (ulong)ppIVar16[uVar2]->typeId;
        }
        if (ppIVar16[uVar13]->opCode == OpTypeCooperativeVectorNV) {
          if (uVar10 != 4) {
            __assert_fail("accessChain.indexChain.size() == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                          ,0xfde,
                          "Id spv::Builder::accessChainLoad(Decoration, Decoration, Decoration, Id, spv::MemoryAccessMask, spv::Scope, unsigned int)"
                         );
          }
          IVar8 = createVectorExtractDynamic(this,uVar2,resultType,*puVar11);
        }
        else {
          if ((this->spvVersion < 0x10400) || (bVar6 = isValidInitializer(this,uVar2), !bVar6)) {
            pIVar5 = (this->module).idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[(this->accessChain).base];
            if (pIVar5 == (Instruction *)0x0) {
              IVar8 = 0;
            }
            else {
              IVar8 = pIVar5->typeId;
            }
            IVar8 = createVariable(this,DecorationMax,Function,IVar8,"indexable",0,true);
            createStore(this,(this->accessChain).base,IVar8,MaskNone,Max,0);
          }
          else {
            uVar2 = (this->accessChain).base;
            pIVar5 = (this->module).idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar2];
            if (pIVar5 == (Instruction *)0x0) {
              IVar8 = 0;
            }
            else {
              IVar8 = pIVar5->typeId;
            }
            IVar8 = createVariable(this,DecorationMax,Function,IVar8,"indexable",uVar2,true);
            addDecoration(this,IVar8,DecorationNonWritable,-1);
          }
          (this->accessChain).base = IVar8;
          (this->accessChain).isRValue = false;
          IVar8 = collapseAccessChain(this);
          IVar8 = createLoad(this,IVar8,precision,MaskNone,Max,0);
        }
      }
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    transferAccessChainSwizzle(this,true);
    pIVar5 = (this->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[(this->accessChain).base];
    if (pIVar5 == (Instruction *)0x0) {
      IVar8 = 0;
    }
    else {
      IVar8 = pIVar5->typeId;
    }
    SVar7 = Module::getStorageClass(&this->module,IVar8);
    memoryAccess_00 = memoryAccess | Aligned;
    if (SVar7 != PhysicalStorageBuffer) {
      memoryAccess_00 = memoryAccess;
    }
    IVar8 = collapseAccessChain(this);
    addDecoration(this,IVar8,l_nonUniform,-1);
    IVar8 = createLoad(this,IVar8,precision,memoryAccess_00,scope,-alignment & alignment);
    addDecoration(this,IVar8,r_nonUniform,-1);
  }
  puVar3 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((puVar4 != puVar3) || ((this->accessChain).component != 0)) {
    if (puVar4 != puVar3) {
      pIVar5 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[IVar8];
      if (pIVar5 == (Instruction *)0x0) {
        IVar9 = 0;
      }
      else {
        IVar9 = pIVar5->typeId;
      }
      IVar9 = getScalarTypeId(this,IVar9);
      uVar10 = (long)(this->accessChain).swizzle.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->accessChain).swizzle.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      if (1 < uVar10) {
        IVar9 = makeVectorType(this,IVar9,(int)uVar10);
      }
      IVar8 = createRvalueSwizzle(this,precision,IVar9,IVar8,&(this->accessChain).swizzle);
    }
    IVar9 = (this->accessChain).component;
    if (((IVar9 != 0) &&
        (IVar8 = createVectorExtractDynamic(this,IVar8,resultType,IVar9), precision != DecorationMax
        )) && (IVar8 != 0)) {
      addDecoration(this,IVar8,precision,-1);
    }
    addDecoration(this,IVar8,r_nonUniform,-1);
  }
  return IVar8;
}

Assistant:

Id Builder::accessChainLoad(Decoration precision, Decoration l_nonUniform,
    Decoration r_nonUniform, Id resultType, spv::MemoryAccessMask memoryAccess,
    spv::Scope scope, unsigned int alignment)
{
    Id id;

    if (accessChain.isRValue) {
        // transfer access chain, but try to stay in registers
        transferAccessChainSwizzle(false);
        if (accessChain.indexChain.size() > 0) {
            Id swizzleBase = accessChain.preSwizzleBaseType != NoType ? accessChain.preSwizzleBaseType : resultType;

            // if all the accesses are constants, we can use OpCompositeExtract
            std::vector<unsigned> indexes;
            bool constant = true;
            for (int i = 0; i < (int)accessChain.indexChain.size(); ++i) {
                if (isConstantScalar(accessChain.indexChain[i]))
                    indexes.push_back(getConstantScalar(accessChain.indexChain[i]));
                else {
                    constant = false;
                    break;
                }
            }

            if (constant) {
                id = createCompositeExtract(accessChain.base, swizzleBase, indexes);
                setPrecision(id, precision);
            } else if (isCooperativeVector(accessChain.base)) {
                assert(accessChain.indexChain.size() == 1);
                id = createVectorExtractDynamic(accessChain.base, resultType, accessChain.indexChain[0]);
            } else {
                Id lValue = NoResult;
                if (spvVersion >= Spv_1_4 && isValidInitializer(accessChain.base)) {
                    // make a new function variable for this r-value, using an initializer,
                    // and mark it as NonWritable so that downstream it can be detected as a lookup
                    // table
                    lValue = createVariable(NoPrecision, StorageClassFunction, getTypeId(accessChain.base),
                        "indexable", accessChain.base);
                    addDecoration(lValue, DecorationNonWritable);
                } else {
                    lValue = createVariable(NoPrecision, StorageClassFunction, getTypeId(accessChain.base),
                        "indexable");
                    // store into it
                    createStore(accessChain.base, lValue);
                }
                // move base to the new variable
                accessChain.base = lValue;
                accessChain.isRValue = false;

                // load through the access chain
                id = createLoad(collapseAccessChain(), precision);
            }
        } else
            id = accessChain.base;  // no precision, it was set when this was defined
    } else {
        transferAccessChainSwizzle(true);

        // take LSB of alignment
        alignment = alignment & ~(alignment & (alignment-1));
        if (getStorageClass(accessChain.base) == StorageClassPhysicalStorageBufferEXT) {
            memoryAccess = (spv::MemoryAccessMask)(memoryAccess | spv::MemoryAccessAlignedMask);
        }

        // load through the access chain
        id = collapseAccessChain();
        // Apply nonuniform both to the access chain and the loaded value.
        // Buffer accesses need the access chain decorated, and this is where
        // loaded image types get decorated. TODO: This should maybe move to
        // createImageTextureFunctionCall.
        addDecoration(id, l_nonUniform);
        id = createLoad(id, precision, memoryAccess, scope, alignment);
        addDecoration(id, r_nonUniform);
    }

    // Done, unless there are swizzles to do
    if (accessChain.swizzle.size() == 0 && accessChain.component == NoResult)
        return id;

    // Do remaining swizzling

    // Do the basic swizzle
    if (accessChain.swizzle.size() > 0) {
        Id swizzledType = getScalarTypeId(getTypeId(id));
        if (accessChain.swizzle.size() > 1)
            swizzledType = makeVectorType(swizzledType, (int)accessChain.swizzle.size());
        id = createRvalueSwizzle(precision, swizzledType, id, accessChain.swizzle);
    }

    // Do the dynamic component
    if (accessChain.component != NoResult)
        id = setPrecision(createVectorExtractDynamic(id, resultType, accessChain.component), precision);

    addDecoration(id, r_nonUniform);
    return id;
}